

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3WhereEnd(WhereInfo *pWInfo)

{
  byte bVar1;
  Parse *pParse_00;
  Vdbe *p;
  SrcList *pSVar2;
  sqlite3 *db_00;
  Table *pTVar3;
  SrcList SVar4;
  int iVar5;
  WhereLevel *pWVar6;
  VdbeOp *local_80;
  VdbeOp *pOp;
  int last;
  int j_1;
  int k;
  int ws;
  Table *pTab;
  SrcList_item *pTabItem;
  Index *pIdx;
  int addr;
  int j;
  InLoop *pIn;
  sqlite3 *db;
  SrcList *pTabList;
  WhereLevel *pLevel;
  int i;
  Vdbe *v;
  Parse *pParse;
  WhereInfo *pWInfo_local;
  
  pParse_00 = pWInfo->pParse;
  p = pParse_00->pVdbe;
  pSVar2 = pWInfo->pTabList;
  db_00 = pParse_00->db;
  sqlite3ExprCacheClear(pParse_00);
  pLevel._4_4_ = pWInfo->nLevel;
  while (pLevel._4_4_ = pLevel._4_4_ + -1, -1 < pLevel._4_4_) {
    pWVar6 = pWInfo->a + pLevel._4_4_;
    sqlite3VdbeResolveLabel(p,pWVar6->addrCont);
    if (pWVar6->op != 0x95) {
      sqlite3VdbeAddOp2(p,(uint)pWVar6->op,pWVar6->p1,pWVar6->p2);
      sqlite3VdbeChangeP5(p,pWVar6->p5);
    }
    if ((((pWVar6->plan).wsFlags & 0x80f1000) != 0) && (0 < (pWVar6->u).in.nIn)) {
      sqlite3VdbeResolveLabel(p,pWVar6->addrNxt);
      pIdx._4_4_ = (pWVar6->u).in.nIn;
      _addr = (pWVar6->u).in.aInLoop + (pIdx._4_4_ + -1);
      for (; 0 < pIdx._4_4_; pIdx._4_4_ = pIdx._4_4_ + -1) {
        sqlite3VdbeJumpHere(p,_addr->addrInTop + 1);
        sqlite3VdbeAddOp2(p,(uint)_addr->eEndLoopOp,_addr->iCur,_addr->addrInTop);
        sqlite3VdbeJumpHere(p,_addr->addrInTop + -1);
        _addr = _addr + -1;
      }
      sqlite3DbFree(db_00,(pWVar6->u).in.aInLoop);
    }
    sqlite3VdbeResolveLabel(p,pWVar6->addrBrk);
    if (pWVar6->iLeftJoin != 0) {
      iVar5 = sqlite3VdbeAddOp1(p,0x78,pWVar6->iLeftJoin);
      if (((pWVar6->plan).wsFlags & 0x400000) == 0) {
        sqlite3VdbeAddOp1(p,0x42,pSVar2->a[pLevel._4_4_].iCursor);
      }
      if (-1 < pWVar6->iIdxCur) {
        sqlite3VdbeAddOp1(p,0x42,pWVar6->iIdxCur);
      }
      if (pWVar6->op == '\x03') {
        sqlite3VdbeAddOp2(p,2,pWVar6->p1,pWVar6->addrFirst);
      }
      else {
        sqlite3VdbeAddOp2(p,1,0,pWVar6->addrFirst);
      }
      sqlite3VdbeJumpHere(p,iVar5);
    }
  }
  sqlite3VdbeResolveLabel(p,pWInfo->iBreak);
  pLevel._4_4_ = 0;
  pTabList = (SrcList *)pWInfo->a;
  do {
    if (pWInfo->nLevel <= pLevel._4_4_) {
      pParse_00->nQueryLoop = pWInfo->savedNQueryLoop;
      whereInfoFree(db_00,pWInfo);
      return;
    }
    pTabItem = (SrcList_item *)0x0;
    bVar1 = *(byte *)((long)&pTabList->a[0].pSelect + 4);
    pTVar3 = pSVar2->a[bVar1].pTab;
    if ((((pTVar3->tabFlags & 2) == 0) && (pTVar3->pSelect == (Select *)0x0)) &&
       ((pWInfo->wctrlFlags & 0x10) == 0)) {
      SVar4 = *pTabList;
      if ((pWInfo->okOnePass == '\0') &&
         (((undefined1  [112])SVar4 & (undefined1  [112])0x400000) == (undefined1  [112])0x0)) {
        sqlite3VdbeAddOp1(p,0x2d,pSVar2->a[bVar1].iCursor);
      }
      if ((((undefined1  [112])SVar4 & (undefined1  [112])0xf0000) != (undefined1  [112])0x0) &&
         (((undefined1  [112])SVar4 & (undefined1  [112])0x20000000) == (undefined1  [112])0x0)) {
        sqlite3VdbeAddOp1(p,0x2d,*(int *)&pTabList->a[0].zAlias);
      }
    }
    if (((undefined1  [112])*pTabList & (undefined1  [112])0xf0000) == (undefined1  [112])0x0) {
      if (((undefined1  [112])*pTabList & (undefined1  [112])0x10000000) != (undefined1  [112])0x0)
      {
        pTabItem = *(SrcList_item **)&pTabList->a[0].jointype;
      }
    }
    else {
      pTabItem = (SrcList_item *)pTabList->a[0].zDatabase;
    }
    if ((pTabItem != (SrcList_item *)0x0) && (db_00->mallocFailed == '\0')) {
      local_80 = sqlite3VdbeGetOp(p,pWInfo->iTop);
      iVar5 = sqlite3VdbeCurrentAddr(p);
      for (last = pWInfo->iTop; last < iVar5; last = last + 1) {
        if (local_80->p1 == *(int *)((long)&pTabList->a[0].zName + 4)) {
          if (local_80->opcode == '\x1d') {
            for (pOp._4_4_ = 0; pOp._4_4_ < (int)(uint)*(ushort *)((long)&pTabItem->pUsing + 4);
                pOp._4_4_ = pOp._4_4_ + 1) {
              if (local_80->p2 == *(int *)(pTabItem->zDatabase + (long)pOp._4_4_ * 4)) {
                local_80->p2 = pOp._4_4_;
                local_80->p1 = *(int *)&pTabList->a[0].zAlias;
                break;
              }
            }
          }
          else if (local_80->opcode == 'A') {
            local_80->p1 = *(int *)&pTabList->a[0].zAlias;
            local_80->opcode = 'c';
          }
        }
        local_80 = local_80 + 1;
      }
    }
    pLevel._4_4_ = pLevel._4_4_ + 1;
    pTabList = (SrcList *)&pTabList->a[0].zIndex;
  } while( true );
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereEnd(WhereInfo *pWInfo){
  Parse *pParse = pWInfo->pParse;
  Vdbe *v = pParse->pVdbe;
  int i;
  WhereLevel *pLevel;
  SrcList *pTabList = pWInfo->pTabList;
  sqlite3 *db = pParse->db;

  /* Generate loop termination code.
  */
  sqlite3ExprCacheClear(pParse);
  for(i=pWInfo->nLevel-1; i>=0; i--){
    pLevel = &pWInfo->a[i];
    sqlite3VdbeResolveLabel(v, pLevel->addrCont);
    if( pLevel->op!=OP_Noop ){
      sqlite3VdbeAddOp2(v, pLevel->op, pLevel->p1, pLevel->p2);
      sqlite3VdbeChangeP5(v, pLevel->p5);
    }
    if( pLevel->plan.wsFlags & WHERE_IN_ABLE && pLevel->u.in.nIn>0 ){
      struct InLoop *pIn;
      int j;
      sqlite3VdbeResolveLabel(v, pLevel->addrNxt);
      for(j=pLevel->u.in.nIn, pIn=&pLevel->u.in.aInLoop[j-1]; j>0; j--, pIn--){
        sqlite3VdbeJumpHere(v, pIn->addrInTop+1);
        sqlite3VdbeAddOp2(v, pIn->eEndLoopOp, pIn->iCur, pIn->addrInTop);
        sqlite3VdbeJumpHere(v, pIn->addrInTop-1);
      }
      sqlite3DbFree(db, pLevel->u.in.aInLoop);
    }
    sqlite3VdbeResolveLabel(v, pLevel->addrBrk);
    if( pLevel->iLeftJoin ){
      int addr;
      addr = sqlite3VdbeAddOp1(v, OP_IfPos, pLevel->iLeftJoin);
      assert( (pLevel->plan.wsFlags & WHERE_IDX_ONLY)==0
           || (pLevel->plan.wsFlags & WHERE_INDEXED)!=0 );
      if( (pLevel->plan.wsFlags & WHERE_IDX_ONLY)==0 ){
        sqlite3VdbeAddOp1(v, OP_NullRow, pTabList->a[i].iCursor);
      }
      if( pLevel->iIdxCur>=0 ){
        sqlite3VdbeAddOp1(v, OP_NullRow, pLevel->iIdxCur);
      }
      if( pLevel->op==OP_Return ){
        sqlite3VdbeAddOp2(v, OP_Gosub, pLevel->p1, pLevel->addrFirst);
      }else{
        sqlite3VdbeAddOp2(v, OP_Goto, 0, pLevel->addrFirst);
      }
      sqlite3VdbeJumpHere(v, addr);
    }
  }

  /* The "break" point is here, just past the end of the outer loop.
  ** Set it.
  */
  sqlite3VdbeResolveLabel(v, pWInfo->iBreak);

  /* Close all of the cursors that were opened by sqlite3WhereBegin.
  */
  assert( pWInfo->nLevel==1 || pWInfo->nLevel==pTabList->nSrc );
  for(i=0, pLevel=pWInfo->a; i<pWInfo->nLevel; i++, pLevel++){
    Index *pIdx = 0;
    struct SrcList_item *pTabItem = &pTabList->a[pLevel->iFrom];
    Table *pTab = pTabItem->pTab;
    assert( pTab!=0 );
    if( (pTab->tabFlags & TF_Ephemeral)==0
     && pTab->pSelect==0
     && (pWInfo->wctrlFlags & WHERE_OMIT_OPEN_CLOSE)==0
    ){
      int ws = pLevel->plan.wsFlags;
      if( !pWInfo->okOnePass && (ws & WHERE_IDX_ONLY)==0 ){
        sqlite3VdbeAddOp1(v, OP_Close, pTabItem->iCursor);
      }
      if( (ws & WHERE_INDEXED)!=0 && (ws & WHERE_TEMP_INDEX)==0 ){
        sqlite3VdbeAddOp1(v, OP_Close, pLevel->iIdxCur);
      }
    }

    /* If this scan uses an index, make code substitutions to read data
    ** from the index in preference to the table. Sometimes, this means
    ** the table need never be read from. This is a performance boost,
    ** as the vdbe level waits until the table is read before actually
    ** seeking the table cursor to the record corresponding to the current
    ** position in the index.
    ** 
    ** Calls to the code generator in between sqlite3WhereBegin and
    ** sqlite3WhereEnd will have created code that references the table
    ** directly.  This loop scans all that code looking for opcodes
    ** that reference the table and converts them into opcodes that
    ** reference the index.
    */
    if( pLevel->plan.wsFlags & WHERE_INDEXED ){
      pIdx = pLevel->plan.u.pIdx;
    }else if( pLevel->plan.wsFlags & WHERE_MULTI_OR ){
      pIdx = pLevel->u.pCovidx;
    }
    if( pIdx && !db->mallocFailed){
      int k, j, last;
      VdbeOp *pOp;

      pOp = sqlite3VdbeGetOp(v, pWInfo->iTop);
      last = sqlite3VdbeCurrentAddr(v);
      for(k=pWInfo->iTop; k<last; k++, pOp++){
        if( pOp->p1!=pLevel->iTabCur ) continue;
        if( pOp->opcode==OP_Column ){
          for(j=0; j<pIdx->nColumn; j++){
            if( pOp->p2==pIdx->aiColumn[j] ){
              pOp->p2 = j;
              pOp->p1 = pLevel->iIdxCur;
              break;
            }
          }
          assert( (pLevel->plan.wsFlags & WHERE_IDX_ONLY)==0
               || j<pIdx->nColumn );
        }else if( pOp->opcode==OP_Rowid ){
          pOp->p1 = pLevel->iIdxCur;
          pOp->opcode = OP_IdxRowid;
        }
      }
    }
  }

  /* Final cleanup
  */
  pParse->nQueryLoop = pWInfo->savedNQueryLoop;
  whereInfoFree(db, pWInfo);
  return;
}